

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::ClientImpl::handle_request
          (ClientImpl *this,Stream *strm,Request *req,Response *res,bool close_connection,
          Error *error)

{
  uint uVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_278 [8];
  Request req2;
  bool ret;
  Error *error_local;
  bool close_connection_local;
  Response *res_local;
  Request *req_local;
  Stream *strm_local;
  ClientImpl *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    uVar1 = (*this->_vptr_ClientImpl[6])();
    if ((((uVar1 & 1) == 0) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) &&
       (this->proxy_port_ != -1)) {
      Request::Request((Request *)local_278,req);
      std::operator+(&local_2b8,"http://",&this->host_and_port_);
      std::operator+(&local_298,&local_2b8,&req->path);
      std::__cxx11::string::operator=
                ((string *)(req2.method.field_2._M_local_buf + 8),(string *)&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_2b8);
      req2.authorization_count_._7_1_ =
           process_request(this,strm,(Request *)local_278,res,close_connection,error);
      Request::~Request((Request *)local_278);
    }
    else {
      req2.authorization_count_._7_1_ = process_request(this,strm,req,res,close_connection,error);
    }
    if ((req2.authorization_count_._7_1_ & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      if (((300 < res->status) && (res->status < 400)) && ((this->follow_location_ & 1U) != 0)) {
        req2.authorization_count_._7_1_ = redirect(this,req,res,error);
      }
      this_local._7_1_ = (bool)(req2.authorization_count_._7_1_ & 1);
    }
    return this_local._7_1_;
  }
  *error = Connection;
  return false;
}

Assistant:

inline bool ClientImpl::handle_request(Stream &strm, const Request &req,
										   Response &res, bool close_connection,
										   Error &error) {
		if (req.path.empty()) {
			error = Error::Connection;
			return false;
		}

		bool ret;

		if (!is_ssl() && !proxy_host_.empty() && proxy_port_ != -1) {
			auto req2 = req;
			req2.path = "http://" + host_and_port_ + req.path;
			ret = process_request(strm, req2, res, close_connection, error);
		} else {
			ret = process_request(strm, req, res, close_connection, error);
		}

		if (!ret) { return false; }

		if (300 < res.status && res.status < 400 && follow_location_) {
			ret = redirect(req, res, error);
		}

#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
		if ((res.status == 401 || res.status == 407) &&
      req.authorization_count_ < 5) {
    auto is_proxy = res.status == 407;
    const auto &username =
        is_proxy ? proxy_digest_auth_username_ : digest_auth_username_;
    const auto &password =
        is_proxy ? proxy_digest_auth_password_ : digest_auth_password_;

    if (!username.empty() && !password.empty()) {
      std::map<std::string, std::string> auth;
      if (detail::parse_www_authenticate(res, auth, is_proxy)) {
        Request new_req = req;
        new_req.authorization_count_ += 1;
        auto key = is_proxy ? "Proxy-Authorization" : "Authorization";
        new_req.headers.erase(key);
        new_req.headers.insert(detail::make_digest_authentication_header(
            req, auth, new_req.authorization_count_, detail::random_string(10),
            username, password, is_proxy));

        Response new_res;

        ret = send(new_req, new_res, error);
        if (ret) { res = new_res; }
      }
    }
  }
#endif

		return ret;
	}